

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

void __thiscall CRegexParser::build_char(CRegexParser *this,re_machine *machine,wchar_t ch)

{
  re_tuple_conflict *prVar1;
  re_state_id rVar2;
  
  rVar2 = alloc_state(this);
  machine->init = rVar2;
  rVar2 = alloc_state(this);
  machine->final = rVar2;
  if ((long)machine->init != -1) {
    prVar1 = this->tuple_arr_ + machine->init;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_LITERAL;
      (prVar1->info).ch = ch;
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  return;
}

Assistant:

void CRegexParser::build_char(re_machine *machine, wchar_t ch)
{
    /* initialize our new machine */
    init_machine(machine);

    /* allocate a transition tuple for the new state */
    set_trans(machine->init, machine->final, RE_LITERAL, ch);
}